

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O1

SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> * __thiscall
SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
          (SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *this,
          longlong bits)

{
  if (bits < 0) {
    __assert_fail("!std::numeric_limits< U >::is_signed || bits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                  ,0x17a9,
                  "SafeInt<T, E> &SafeInt<unsigned int>::operator>>=(U) [T = unsigned int, E = safeint_exception_handlers::SafeInt_InvalidParameter, U = long long]"
                 );
  }
  if (bits < 0x20) {
    *(uint *)this = *(uint *)this >> ((byte)bits & 0x1f);
    return (SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)this;
  }
  __assert_fail("bits < (int)safeint_internal::int_traits< T >::bitCount",
                "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                ,0x17aa,
                "SafeInt<T, E> &SafeInt<unsigned int>::operator>>=(U) [T = unsigned int, E = safeint_exception_handlers::SafeInt_InvalidParameter, U = long long]"
               );
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E >& operator >>=( U bits ) SAFEINT_NOTHROW
    {
        ShiftAssert( !std::numeric_limits< U >::is_signed || bits >= 0 );
        ShiftAssert( bits < (int)safeint_internal::int_traits< T >::bitCount );

        m_int >>= bits;
        return *this;
    }